

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O0

void Gia_ManResubTest3_(void)

{
  Gia_ResbMan_t *p_00;
  ulong local_68;
  word Truth;
  Vec_Int_t *pVStack_58;
  int i;
  Vec_Int_t *vRes;
  Vec_Ptr_t *vDivs;
  word Divs [6];
  Gia_ResbMan_t *p;
  
  p_00 = Gia_ResbAlloc(1);
  memset(&vDivs,0,0x30);
  Divs[1] = 0xaaaaaaaaaaaaaaaa;
  Divs[2] = 0xcccccccccccccccc;
  Divs[3] = 0xf0f0f0f0f0f0f0f0;
  Divs[4] = 0xff00ff00ff00ff00;
  vRes = (Vec_Int_t *)Vec_PtrAlloc(6);
  pVStack_58 = Vec_IntAlloc(100);
  for (Truth._4_4_ = 0; Truth._4_4_ < 6; Truth._4_4_ = Truth._4_4_ + 1) {
    Vec_PtrPush((Vec_Ptr_t *)vRes,Divs + (long)Truth._4_4_ + -1);
  }
  local_68 = (Divs[1] | Divs[2]) & Divs[3] & Divs[4];
  vDivs = (Vec_Ptr_t *)(local_68 ^ 0xffffffffffffffff);
  Divs[0] = local_68;
  Extra_PrintHex(_stdout,(uint *)&local_68,6);
  printf(" ");
  Dau_DsdPrintFromTruth2(&local_68,6);
  printf("       ");
  Gia_ManResubPerform(p_00,(Vec_Ptr_t *)vRes,1,100,0,0x32,1,1,0);
  Gia_ResbFree(p_00);
  Vec_IntFree(pVStack_58);
  Vec_PtrFree((Vec_Ptr_t *)vRes);
  return;
}

Assistant:

void Gia_ManResubTest3_()
{
    Gia_ResbMan_t * p = Gia_ResbAlloc( 1 );
    word Divs[6] = { 0, 0, 
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0xCCCCCCCCCCCCCCCC),
        ABC_CONST(0xF0F0F0F0F0F0F0F0),
        ABC_CONST(0xFF00FF00FF00FF00) 
    };
    Vec_Ptr_t * vDivs = Vec_PtrAlloc( 6 );
    Vec_Int_t * vRes = Vec_IntAlloc( 100 );
    int i; 
    for ( i = 0; i < 6; i++ )
        Vec_PtrPush( vDivs, Divs+i );

    {
        word Truth = (Divs[2] | Divs[3]) & (Divs[4] & Divs[5]);
//        word Truth = (~Divs[2] | Divs[3]) | ~Divs[4];
        Divs[0] = ~Truth;
        Divs[1] =  Truth;
        Extra_PrintHex( stdout, (unsigned*)&Truth, 6 );
        printf( " " );
        Dau_DsdPrintFromTruth2( &Truth, 6 );
        printf( "       " );
        Gia_ManResubPerform( p, vDivs, 1, 100, 0, 50, 1, 1, 0 );
    }
    Gia_ResbFree( p );
    Vec_IntFree( vRes );
    Vec_PtrFree( vDivs );
}